

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.cc
# Opt level: O3

void lf::base::PrintInfo(ostream *stream,RefEl *ref_el,int output_ctrl)

{
  RefEl RVar1;
  dim_t dVar2;
  size_type sVar3;
  ostream *poVar4;
  MatrixXd *pMVar5;
  CoeffReturnType CVar6;
  RefEl local_b5;
  uint local_b4;
  Index local_b0;
  string local_a8;
  size_type local_6c;
  RefEl local_68 [56];
  
  dVar2 = internal::DimensionImpl(ref_el->type_);
  local_b0 = CONCAT44(local_b0._4_4_,dVar2);
  sVar3 = RefEl::NumNodes(ref_el);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"Type of reference element: ",0x1b);
  RefEl::ToString_abi_cxx11_(&local_a8,ref_el);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)CONCAT71(local_a8._M_dataplus._M_p._1_7_,
                                              local_a8._M_dataplus._M_p._0_1_),
                      local_a8._M_string_length);
  local_68[0].type_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_68,1);
  local_b4 = output_ctrl;
  local_6c = sVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_a8._M_dataplus._M_p._1_7_,local_a8._M_dataplus._M_p._0_1_) !=
      &local_a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_a8._M_dataplus._M_p._1_7_,local_a8._M_dataplus._M_p._0_1_),
                    local_a8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"Dimension: ",0xb);
  dVar2 = (dim_t)local_b0;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  local_a8._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_a8,1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"Number of nodes: ",0x11);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  local_a8._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_a8,1);
  if (dVar2 != 0 && 0 < (int)local_b4) {
    do {
      sVar3 = RefEl::NumSubEntities(ref_el,dVar2);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"Codimension ",0xc);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," has ",5);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," entities of type ",0x12);
      local_b5 = RefEl::SubType(ref_el,dVar2,0);
      RefEl::ToString_abi_cxx11_(&local_a8,&local_b5);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)CONCAT71(local_a8._M_dataplus._M_p._1_7_,
                                                  local_a8._M_dataplus._M_p._0_1_),
                          local_a8._M_string_length);
      local_68[0].type_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_68,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_a8._M_dataplus._M_p._1_7_,local_a8._M_dataplus._M_p._0_1_) !=
          &local_a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_a8._M_dataplus._M_p._1_7_,local_a8._M_dataplus._M_p._0_1_),
                        local_a8.field_2._M_allocated_capacity + 1);
      }
      if (10 < local_b4) {
        while (sVar3 != 0) {
          sVar3 = sVar3 - 1;
          std::__ostream_insert<char,std::char_traits<char>>(stream," Subentity ",0xb);
          poVar4 = (ostream *)std::ostream::operator<<(stream,sVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," is of type ",0xc);
          local_68[0] = RefEl::SubType(ref_el,dVar2,0);
          RefEl::ToString_abi_cxx11_(&local_a8,local_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(char *)CONCAT71(local_a8._M_dataplus._M_p._1_7_,
                                             local_a8._M_dataplus._M_p._0_1_),
                     local_a8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_a8._M_dataplus._M_p._1_7_,local_a8._M_dataplus._M_p._0_1_) !=
              &local_a8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_a8._M_dataplus._M_p._1_7_,local_a8._M_dataplus._M_p._0_1_
                                    ),local_a8.field_2._M_allocated_capacity + 1);
          }
          RVar1 = RefEl::SubType(ref_el,dVar2,0);
          if ((0x14 < local_b4) && (RVar1.type_ == kPoint)) {
            std::__ostream_insert<char,std::char_traits<char>>(stream," and has coordinates [",0x16)
            ;
            pMVar5 = RefEl::NodeCoords(ref_el);
            local_b0 = (Index)(int)sVar3;
            Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                      ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                       &local_a8,pMVar5,local_b0);
            CVar6 = Eigen::
                    DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  *)&local_a8,0);
            poVar4 = std::ostream::_M_insert<double>(CVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            pMVar5 = RefEl::NodeCoords(ref_el);
            Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                      ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                       local_68,pMVar5,local_b0);
            CVar6 = Eigen::
                    DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>
                    ::operator[]((DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                  *)local_68,1);
            poVar4 = std::ostream::_M_insert<double>(CVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
            local_b5.type_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_b5,1);
          }
          local_a8._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_a8,1);
        }
      }
      dVar2 = dVar2 - 1;
    } while (dVar2 != 0);
  }
  return;
}

Assistant:

void PrintInfo(std::ostream &stream, const RefEl &ref_el, int output_ctrl) {
  const base::dim_t dim_ref_el = ref_el.Dimension();
  const base::dim_t no_nodes = ref_el.NumNodes();
  stream << "Type of reference element: " << ref_el.ToString() << '\n';
  stream << "Dimension: " << dim_ref_el << '\n';
  stream << "Number of nodes: " << no_nodes << '\n';

  if (output_ctrl > 0) {
    // Loop over dimensions
    for (base::dim_t co_dim = dim_ref_el; co_dim > 0; co_dim--) {
      base::dim_t num_sub_ent = ref_el.NumSubEntities(co_dim);
      stream << "Codimension " << co_dim << " has " << num_sub_ent
             << " entities of type " << ref_el.SubType(co_dim, 0).ToString()
             << '\n';

      if (output_ctrl > 10) {
        for (; num_sub_ent > 0; num_sub_ent--) {
          const std::int32_t sub_ent =
              static_cast<std::int32_t>(num_sub_ent) - 1;
          stream << " Subentity " << sub_ent << " is of type "
                 << ref_el.SubType(co_dim, 0).ToString();

          if (ref_el.SubType(co_dim, 0) == RefEl::kPoint() &&
              output_ctrl > 20) {
            stream << " and has coordinates ["
                   << ref_el.NodeCoords().col(sub_ent)[0] << " "
                   << ref_el.NodeCoords().col(sub_ent)[1] << "]" << '\n';
          }
          stream << '\n';
        }
      }
    }
  }
}